

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isFixedPointDepthTextureFormat(TextureFormat *format)

{
  TextureChannelClass TVar1;
  TextureChannelClass channelClass;
  TextureFormat *format_local;
  
  TVar1 = getTextureChannelClass(format->type);
  if (format->order == D) {
    format_local._7_1_ = TVar1 != TEXTURECHANNELCLASS_FLOATING_POINT;
  }
  else if (format->order == DS) {
    switch(format->type) {
    case UNSIGNED_INT_16_8_8:
      format_local._7_1_ = true;
      break;
    case UNSIGNED_INT_24_8:
      format_local._7_1_ = true;
      break;
    case UNSIGNED_INT_24_8_REV:
      format_local._7_1_ = true;
      break;
    default:
      format_local._7_1_ = true;
      break;
    case FLOAT_UNSIGNED_INT_24_8_REV:
      format_local._7_1_ = false;
    }
  }
  else {
    format_local._7_1_ = false;
  }
  return format_local._7_1_;
}

Assistant:

static bool isFixedPointDepthTextureFormat (const tcu::TextureFormat& format)
{
	const tcu::TextureChannelClass channelClass = tcu::getTextureChannelClass(format.type);

	if (format.order == TextureFormat::D)
	{
		// depth internal formats cannot be non-normalized integers
		return channelClass != tcu::TEXTURECHANNELCLASS_FLOATING_POINT;
	}
	else if (format.order == TextureFormat::DS)
	{
		// combined formats have no single channel class, detect format manually
		switch (format.type)
		{
			case tcu::TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return false;
			case tcu::TextureFormat::UNSIGNED_INT_16_8_8:			return true;
			case tcu::TextureFormat::UNSIGNED_INT_24_8:				return true;
			case tcu::TextureFormat::UNSIGNED_INT_24_8_REV:			return true;

			default:
			{
				// unknown format
				DE_ASSERT(false);
				return true;
			}
		}
	}

	return false;
}